

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::OcclusionTextureInfo::~OcclusionTextureInfo(OcclusionTextureInfo *this)

{
  OcclusionTextureInfo *this_local;
  
  std::__cxx11::string::~string((string *)&this->extensions_json_string);
  std::__cxx11::string::~string((string *)&this->extras_json_string);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::~map(&this->extensions);
  Value::~Value(&this->extras);
  return;
}

Assistant:

OcclusionTextureInfo() = default;